

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CGL::GLScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  _List_node_base _Var1;
  _List_node_base _Var2;
  _List_node_base _Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_78;
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_38 [16];
  double local_28;
  
  lVar13 = 0xb0;
  if ((Halfedge *)(this->selectedFeature).element != h) {
    lVar13 = (ulong)((Halfedge *)(this->hoveredFeature).element == h) * 8 + 0xa0;
  }
  DrawStyle::style_halfedge
            (*(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar13));
  p_Var4 = (h->_next)._M_node;
  p_Var5 = (h->_vertex)._M_node;
  p_Var6 = p_Var4[2]._M_prev;
  p_Var7 = p_Var4[2]._M_next[2]._M_prev;
  _Var1 = p_Var6[2];
  _Var2 = p_Var5[2];
  auVar10 = vsubpd_avx((undefined1  [16])_Var1,(undefined1  [16])_Var2);
  p_Var4 = p_Var6[3]._M_next;
  p_Var5 = p_Var5[3]._M_next;
  _Var3 = p_Var7[2];
  auVar18 = vsubpd_avx((undefined1  [16])_Var3,(undefined1  [16])_Var1);
  p_Var6 = p_Var7[3]._M_next;
  auVar11 = vsubpd_avx((undefined1  [16])_Var2,(undefined1  [16])_Var3);
  auVar11 = vsubpd_avx(auVar10,auVar11);
  auVar10 = vsubpd_avx(auVar18,auVar10);
  local_38._0_8_ = (double)_Var2._M_next + auVar11._0_8_ * 0.5 * 0.2;
  local_38._8_8_ = (double)_Var2._M_prev + auVar11._8_8_ * 0.5 * 0.2;
  local_28 = (((double)p_Var4 - (double)p_Var5) - ((double)p_Var5 - (double)p_Var6)) * 0.5 * 0.2 +
             (double)p_Var5;
  local_58._0_8_ = (double)_Var1._M_next + auVar10._0_8_ * 0.5 * 0.2;
  local_58._8_8_ = (double)_Var1._M_prev + auVar10._8_8_ * 0.5 * 0.2;
  local_48 = (double)p_Var4 +
             (((double)p_Var6 - (double)p_Var4) - ((double)p_Var4 - (double)p_Var5)) * 0.5 * 0.2;
  auVar18 = vsubpd_avx(local_58,local_38);
  dVar12 = local_48 - local_28;
  auVar10 = vshufpd_avx(auVar18,auVar18,1);
  dVar8 = auVar10._0_8_ * 0.2;
  Face::normal((Vector3D *)&local_78.field_0,(Face *)((h->_face)._M_node + 1));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_78.field_0.x;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar8;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar12;
  auVar10 = vunpcklpd_avx(auVar10,auVar18);
  auVar16._0_8_ = auVar10._0_8_ * 0.2;
  auVar16._8_8_ = auVar10._8_8_ * 0.2;
  auVar18._8_8_ = local_78.field_0.z;
  auVar18._0_8_ = local_78._16_8_;
  auVar10 = vunpcklpd_avx(auVar18,auVar14);
  auVar18 = vunpcklpd_avx(auVar11,auVar16);
  auVar19._0_8_ = auVar18._0_8_ * auVar10._0_8_;
  auVar19._8_8_ = auVar18._8_8_ * auVar10._8_8_;
  auVar20._0_8_ = local_78.field_0.y * auVar16._0_8_;
  auVar20._8_8_ = local_78.field_0.z * auVar16._8_8_;
  auVar18 = vsubpd_avx(auVar20,auVar19);
  auVar10 = vshufpd_avx(auVar16,auVar16,1);
  dVar12 = auVar10._0_8_ * local_78.field_0.y;
  dVar9 = local_78.field_0.x * dVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar8 * -0.8660254037844387;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar10._0_8_ * -0.8660254037844387;
  auVar10 = vunpcklpd_avx(auVar17,auVar15);
  local_78.field_0.x = auVar10._0_8_ + (double)local_58._0_8_ + auVar18._0_8_ * 0.49999999999999994;
  local_78.field_0.y = auVar10._8_8_ + (double)local_58._8_8_ + auVar18._8_8_ * 0.49999999999999994;
  local_78.field_0.z =
       (dVar9 - dVar12) * 0.49999999999999994 + auVar16._0_8_ * -0.8660254037844387 + local_48;
  glBegin(3);
  glVertex3dv(local_38);
  glVertex3dv(local_58);
  glVertex3dv(&local_78);
  glEnd();
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D& p0 = h->vertex()->position;
  const Vector3D& p1 = h->next()->vertex()->position;
  const Vector3D& p2 = h->next()->next()->vertex()->position;

  const Vector3D& e01 = p1-p0;
  const Vector3D& e12 = p2-p1;
  const Vector3D& e20 = p0-p2;

  const Vector3D& u = (e01 - e20) / 2;
  const Vector3D& v = (e12 - e01) / 2;

  const Vector3D& a = p0 + u / 5;
  const Vector3D& b = p1 + v / 5;

  const Vector3D& s = (b-a) / 5;
  const Vector3D& t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D& c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}